

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tan.c
# Opt level: O0

double tancot(double xx,int cotflg)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_48;
  uint local_44;
  int sign;
  int j;
  double zz;
  double z;
  double y;
  double x;
  int cotflg_local;
  double xx_local;
  
  if (0.0 <= xx) {
    local_48 = 1;
    y = xx;
  }
  else {
    y = -xx;
    local_48 = -1;
  }
  if (y <= lossth) {
    z = floor(y / PIO4);
    dVar1 = ldexp(z,-3);
    dVar1 = floor(dVar1);
    dVar1 = ldexp(dVar1,3);
    local_44 = (uint)(z - dVar1);
    if ((local_44 & 1) != 0) {
      local_44 = local_44 + 1;
      z = z + 1.0;
    }
    z = ((y - z * DP1) - z * DP2) - z * DP3;
    dVar1 = z * z;
    if (1e-14 < dVar1) {
      dVar2 = polevl(dVar1,P,2);
      dVar3 = p1evl(dVar1,Q,4);
      z = z + z * ((dVar1 * dVar2) / dVar3);
    }
    if ((local_44 & 2) == 0) {
      if (cotflg != 0) {
        z = 1.0 / z;
      }
    }
    else if (cotflg == 0) {
      z = -1.0 / z;
    }
    else {
      z = -z;
    }
    if (local_48 < 0) {
      z = -z;
    }
    xx_local = z;
  }
  else {
    if (cotflg == 0) {
      mtherr("tan",5);
    }
    else {
      mtherr("cot",5);
    }
    xx_local = 0.0;
  }
  return xx_local;
}

Assistant:

static double tancot( xx, cotflg )
double xx;
int cotflg;
{
double x, y, z, zz;
int j, sign;

/* make argument positive but save the sign */
if( xx < 0 )
	{
	x = -xx;
	sign = -1;
	}
else
	{
	x = xx;
	sign = 1;
	}

if( x > lossth )
	{
	if( cotflg )
		mtherr( "cot", TLOSS );
	else
		mtherr( "tan", TLOSS );
	return(0.0);
	}

/* compute x mod PIO4 */
y = floor( x/PIO4 );

/* strip high bits of integer part */
z = ldexp( y, -3 );
z = floor(z);		/* integer part of y/8 */
z = y - ldexp( z, 3 );  /* y - 16 * (y/16) */

/* integer and fractional part modulo one octant */
j = (int)z;

/* map zeros and singularities to origin */
if( j & 1 )
	{
	j += 1;
	y += 1.0;
	}

z = ((x - y * DP1) - y * DP2) - y * DP3;

zz = z * z;

if( zz > 1.0e-14 )
	y = z  +  z * (zz * polevl( zz, P, 2 )/p1evl(zz, Q, 4));
else
	y = z;
	
if( j & 2 )
	{
	if( cotflg )
		y = -y;
	else
		y = -1.0/y;
	}
else
	{
	if( cotflg )
		y = 1.0/y;
	}

if( sign < 0 )
	y = -y;

return( y );
}